

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GUILayout.cpp
# Opt level: O3

void __thiscall GUILayout::resetContext(GUILayout *this)

{
  lay_context *ctx;
  pointer ppNVar1;
  lay_id item;
  
  ctx = &this->m_lctx;
  lay_reset_context(ctx);
  ppNVar1 = (this->m_namedElements).
            super__Vector_base<GUILayout::NamedElement_*,_std::allocator<GUILayout::NamedElement_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_namedElements).
      super__Vector_base<GUILayout::NamedElement_*,_std::allocator<GUILayout::NamedElement_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppNVar1) {
    (this->m_namedElements).
    super__Vector_base<GUILayout::NamedElement_*,_std::allocator<GUILayout::NamedElement_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppNVar1;
  }
  item = lay_item(ctx);
  this->m_root = item;
  lay_set_size_xy(ctx,item,(lay_scalar)(this->m_size).x,(lay_scalar)(this->m_size).y);
  return;
}

Assistant:

void GUILayout::resetContext()
{
    lay_reset_context(&m_lctx);
    m_namedElements.clear();
    m_root = item();
    lay_set_size_xy(&m_lctx, m_root, lay_scalar(m_size.x), lay_scalar(m_size.y));
}